

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashMap.hpp
# Opt level: O1

Iterator __thiscall
HashMap<Socket_*,_Socket::Poll::Private::SocketInfo>::insert
          (HashMap<Socket_*,_Socket::Poll::Private::SocketInfo> *this,Iterator *position,
          Socket **key,SocketInfo *value)

{
  Socket *pSVar1;
  Item *pIVar2;
  uint uVar3;
  SOCKET SVar4;
  Item **ppIVar5;
  ItemBlock *pIVar6;
  long lVar7;
  Item *pIVar8;
  ulong uVar9;
  Item *pIVar10;
  Iterator *pIVar11;
  ulong uVar12;
  
  ppIVar5 = this->data;
  if (ppIVar5 != (Item **)0x0) {
    for (pIVar8 = ppIVar5[((ulong)*key >> 3) % this->capacity]; pIVar8 != (Item *)0x0;
        pIVar8 = pIVar8->nextCell) {
      if (pIVar8->key == *key) goto LAB_001190e4;
    }
  }
  pIVar8 = (this->_end).item;
LAB_001190e4:
  if (pIVar8 == (this->_end).item) {
    if (ppIVar5 == (Item **)0x0) {
      uVar12 = this->capacity << 3;
      ppIVar5 = (Item **)operator_new__(uVar12);
      this->data = ppIVar5;
      Memory::zero(ppIVar5,uVar12);
    }
    pIVar8 = this->freeItem;
    if (pIVar8 == (Item *)0x0) {
      pIVar6 = (ItemBlock *)operator_new__(0xe8);
      pIVar6->next = this->blocks;
      this->blocks = pIVar6;
      pIVar8 = this->freeItem;
      lVar7 = 0x40;
      uVar12 = 8;
      do {
        uVar9 = uVar12;
        *(Item **)((long)&pIVar6[5].next + lVar7) = pIVar8;
        pIVar8 = (Item *)((long)&pIVar6->next + lVar7);
        lVar7 = lVar7 + 0x38;
        uVar12 = uVar9 + 0x38;
      } while (uVar12 < 0xb0);
      pIVar8 = (Item *)(pIVar6 + 1);
      pIVar10 = (Item *)((long)&pIVar6[7].next + uVar9);
    }
    else {
      pIVar10 = pIVar8->prev;
    }
    this->freeItem = pIVar10;
    pSVar1 = *key;
    pIVar8->key = pSVar1;
    uVar3 = value->events;
    SVar4 = value->s;
    (pIVar8->value).socket = value->socket;
    (pIVar8->value).events = uVar3;
    (pIVar8->value).s = SVar4;
    ppIVar5 = this->data + ((ulong)pSVar1 >> 3) % this->capacity;
    pIVar8->cell = ppIVar5;
    pIVar10 = *ppIVar5;
    pIVar8->nextCell = pIVar10;
    if (pIVar10 != (Item *)0x0) {
      pIVar10->cell = &pIVar8->nextCell;
    }
    *ppIVar5 = pIVar8;
    pIVar10 = position->item;
    pIVar2 = pIVar10->prev;
    pIVar8->prev = pIVar2;
    if (pIVar2 == (Item *)0x0) {
      pIVar11 = &this->_begin;
    }
    else {
      pIVar11 = (Iterator *)&pIVar10->prev->next;
    }
    pIVar11->item = pIVar8;
    pIVar8->next = pIVar10;
    pIVar10->prev = pIVar8;
    this->_size = this->_size + 1;
  }
  else {
    uVar3 = value->events;
    SVar4 = value->s;
    (pIVar8->value).socket = value->socket;
    (pIVar8->value).events = uVar3;
    (pIVar8->value).s = SVar4;
  }
  return (Iterator)pIVar8;
}

Assistant:

Iterator insert(const Iterator& position, const T& key, const V& value)
  {
    Iterator it = find(key);
    if(it != _end)
    {
      *it = value;
      return it;
    }

    if(!data)
    {
      data = (Item**)new char[sizeof(Item*) * capacity];
      Memory::zero(data, sizeof(Item*) * capacity);
    }
    
    Item* item;
    if(freeItem)
    {
      item = freeItem;
      freeItem = freeItem->prev;
    }
    else
    {
      ItemBlock* itemBlock = (ItemBlock*)new char[sizeof(ItemBlock) + sizeof(Item) * 4];
      itemBlock->next = blocks;
      blocks = itemBlock;
      item = (Item*)((char*)itemBlock + sizeof(ItemBlock));

      for(Item* i = item + 1, * end = item + 4; i < end; ++i)
      {
        i->prev = freeItem;
        freeItem = i;
      }
    }

    usize hashCode = hash(key);
#ifdef VERIFY
    VERIFY(new(item) Item(key, value) == item);
#else
    new(item) Item(key, value);
#endif

    Item** cell;
    item->cell = (cell = &data[hashCode % capacity]);
    if((item->nextCell = *cell))
      item->nextCell->cell = &item->nextCell;
    *cell = item;
    
    Item* insertPos = position.item;
    if((item->prev = insertPos->prev))
      insertPos->prev->next = item;
    else
      _begin.item = item;

    item->next = insertPos;
    insertPos->prev = item;
    ++_size;
    return item;
  }